

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.h
# Opt level: O0

type rest_rpc::rpc_service::router::
     call_helper<void(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&),0ul,std::__cxx11::string>
               (_func_void_weak_ptr<rest_rpc::rpc_service::connection>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                **f,index_sequence<0UL> *param_2,
               tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *tup,weak_ptr<rest_rpc::rpc_service::connection> *ptr)

{
  code *pcVar1;
  __tuple_element_t<0UL,_tuple<basic_string<char>_>_> *p_Var2;
  weak_ptr<rest_rpc::rpc_service::connection> *in_RCX;
  undefined8 *in_RDI;
  weak_ptr<rest_rpc::rpc_service::connection> *in_stack_ffffffffffffff98;
  undefined1 local_30 [48];
  
  pcVar1 = (code *)*in_RDI;
  std::weak_ptr<rest_rpc::rpc_service::connection>::weak_ptr(in_RCX,in_stack_ffffffffffffff98);
  p_Var2 = std::get<0ul,std::__cxx11::string>
                     ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x202020);
  (*pcVar1)(local_30,p_Var2);
  std::weak_ptr<rest_rpc::rpc_service::connection>::~weak_ptr
            ((weak_ptr<rest_rpc::rpc_service::connection> *)0x20203b);
  return;
}

Assistant:

static typename std::result_of<F(std::weak_ptr<connection>, Args...)>::type
  call_helper(const F &f, const nonstd::index_sequence<I...> &,
              std::tuple<Args...> tup, std::weak_ptr<connection> ptr) {
    return f(ptr, std::move(std::get<I>(tup))...);
  }